

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::AccessChainTraverser::visitSymbol(AccessChainTraverser *this,TIntermSymbol *symbol)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermSymbol *symbol_local;
  AccessChainTraverser *this_local;
  
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x140))();
  if ((uVar3 & 1) != 0) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    this->topLevelStorageQualifier =
         (TStorageQualifier)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f;
  }
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
  bVar1 = IsAnonymous((TString *)CONCAT44(extraout_var_01,iVar2));
  if (!bVar1) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&this->path,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               CONCAT44(extraout_var_02,iVar2));
  }
  return;
}

Assistant:

void visitSymbol(TIntermSymbol* symbol) override {
        if (symbol->getType().isOpaque())
            topLevelStorageQualifier = symbol->getQualifier().storage;
        if (!IsAnonymous(symbol->getName()))
            path.append(symbol->getName());
    }